

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void * mpc_realloc(mpc_input_t *i,void *p,size_t n)

{
  int iVar1;
  char *q;
  size_t n_local;
  void *p_local;
  mpc_input_t *i_local;
  
  iVar1 = mpc_mem_ptr(i,p);
  if (iVar1 == 0) {
    i_local = (mpc_input_t *)realloc(p,n);
  }
  else {
    i_local = (mpc_input_t *)p;
    if (0x40 < n) {
      i_local = (mpc_input_t *)malloc(n);
      memcpy(i_local,p,0x40);
      mpc_free(i,p);
    }
  }
  return i_local;
}

Assistant:

static void *mpc_realloc(mpc_input_t *i, void *p, size_t n) {

  char *q = NULL;

  if (!mpc_mem_ptr(i, p)) { return realloc(p, n); }

  if (n > sizeof(mpc_mem_t)) {
    q = malloc(n);
    memcpy(q, p, sizeof(mpc_mem_t));
    mpc_free(i, p);
    return q;
  }

  return p;
}